

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O3

Rep * __thiscall absl::lts_20250127::crc_internal::CrcCordState::mutable_rep(CrcCordState *this)

{
  deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  *this_00;
  RefcountedRep *pRVar1;
  RefcountedRep *pRVar2;
  
  if ((this->refcounted_rep_->count).super___atomic_base<int>._M_i == 1) {
    pRVar2 = this->refcounted_rep_;
  }
  else {
    pRVar2 = (RefcountedRep *)operator_new(0x68);
    (pRVar2->count).super___atomic_base<int>._M_i = 1;
    (pRVar2->rep).removed_prefix.length = 0;
    (pRVar2->rep).removed_prefix.crc.crc_ = 0;
    this_00 = &(pRVar2->rep).prefix_crc;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    (pRVar2->rep).prefix_crc.
    super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    std::
    _Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ::_M_initialize_map(&this_00->
                         super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                        ,0);
    pRVar1 = this->refcounted_rep_;
    (pRVar2->rep).removed_prefix.crc.crc_ = (pRVar1->rep).removed_prefix.crc.crc_;
    (pRVar2->rep).removed_prefix.length = (pRVar1->rep).removed_prefix.length;
    std::
    deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
    ::operator=(this_00,&(pRVar1->rep).prefix_crc);
    Unref(this->refcounted_rep_);
    this->refcounted_rep_ = pRVar2;
  }
  return &pRVar2->rep;
}

Assistant:

Rep* mutable_rep() {
    if (refcounted_rep_->count.load(std::memory_order_acquire) != 1) {
      RefcountedRep* copy = new RefcountedRep;
      copy->rep = refcounted_rep_->rep;
      Unref(refcounted_rep_);
      refcounted_rep_ = copy;
    }
    return &refcounted_rep_->rep;
  }